

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven_lite.cc
# Opt level: O2

void google::protobuf::internal::anon_unknown_15::UnknownFieldHandlerLite::Varint
               (MessageLite *msg,ParseTable *table,int tag,int value)

{
  LogMessage *other;
  string *target;
  undefined1 local_90 [8];
  CodedOutputStream unknown_fields_stream;
  StringOutputStream unknown_fields_string;
  
  if (table->unknown_field_set == true) {
    LogMessage::LogMessage
              ((LogMessage *)local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/generated_message_table_driven_lite.cc"
               ,0x45);
    other = LogMessage::operator<<
                      ((LogMessage *)local_90,"CHECK failed: !table.unknown_field_set: ");
    LogFinisher::operator=((LogFinisher *)&unknown_fields_stream.start_count_,other);
    LogMessage::~LogMessage((LogMessage *)local_90);
  }
  target = (anonymous_namespace)::MutableUnknownFields_abi_cxx11_(msg,table->arena_offset);
  io::StringOutputStream::StringOutputStream
            ((StringOutputStream *)&unknown_fields_stream.start_count_,target);
  io::CodedOutputStream::CodedOutputStream
            ((CodedOutputStream *)local_90,
             (ZeroCopyOutputStream *)&unknown_fields_stream.start_count_,false);
  io::CodedOutputStream::WriteVarint32((CodedOutputStream *)local_90,tag);
  io::CodedOutputStream::WriteVarint32((CodedOutputStream *)local_90,value);
  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_90);
  return;
}

Assistant:

static void Varint(MessageLite* msg, const ParseTable& table, int tag,
                     int value) {
    GOOGLE_DCHECK(!table.unknown_field_set);

    io::StringOutputStream unknown_fields_string(
        MutableUnknownFields(msg, table.arena_offset));
    io::CodedOutputStream unknown_fields_stream(&unknown_fields_string, false);
    unknown_fields_stream.WriteVarint32(tag);
    unknown_fields_stream.WriteVarint32(value);
  }